

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_depspawn_sync.cpp
# Opt level: O2

void h(int *i,bool *test_ok)

{
  long lVar1;
  ostream *poVar2;
  Observer __depspawn_temporary72;
  
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"h begin: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  poVar2 = std::operator<<(poVar2," with i=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*i);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  *i = 0;
  depspawn::Observer::Observer(&__depspawn_temporary72,true);
  depspawn::spawn<void(int&),int&>(g,i);
  depspawn::spawn<void(int&),int&>(g,i);
  depspawn::spawn<void(int&),int&>(f,i);
  depspawn::Observer::~Observer(&__depspawn_temporary72);
  *test_ok = (bool)(*test_ok & *i == 0xc);
  poVar2 = std::operator<<((ostream *)&std::cout,"x = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,x);
  std::endl<char,std::char_traits<char>>(poVar2);
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"h finish: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  poVar2 = std::operator<<(poVar2," with i=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*i);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  return;
}

Assistant:

void h(int &i, bool& test_ok) {
  LOG("h begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
  
  i = 0;
  
  depspawn_sync(
    spawn(g, i); //Sets x to 1
    spawn(g, i); //Sets x to 2
    spawn(f, i); //Sets x to 12
  )
  
  test_ok = test_ok && (i == 12);
  std::cout << "x = " << x << std::endl;
  
  LOG("h finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}